

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O2

void xmlSAX2EntityDecl(void *ctx,xmlChar *name,int type,xmlChar *publicId,xmlChar *systemId,
                      xmlChar *content)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *msg;
  xmlParserErrors error;
  xmlChar *base;
  xmlParserCtxtPtr ctxt;
  xmlChar *URI;
  xmlEntityPtr ent;
  
  if (ctx == (void *)0x0) {
    return;
  }
  if (*(xmlDocPtr *)((long)ctx + 0x10) == (xmlDocPtr)0x0) {
    return;
  }
  iVar3 = *(int *)((long)ctx + 0x150);
  iVar2 = xmlAddEntity(*(xmlDocPtr *)((long)ctx + 0x10),(uint)(iVar3 == 2),name,type,publicId,
                       systemId,content,&ent);
  if (iVar2 == 0) {
    if (systemId == (xmlChar *)0x0) {
      return;
    }
    if (ent->URI != (xmlChar *)0x0) {
      return;
    }
    uVar4 = (ulong)*(uint *)((long)ctx + 0x40);
    do {
      if ((int)uVar4 < 1) {
        base = *(xmlChar **)((long)ctx + 0x118);
        break;
      }
      lVar1 = uVar4 * 8;
      uVar4 = uVar4 - 1;
      base = *(xmlChar **)(*(long *)(*(long *)((long)ctx + 0x48) + -8 + lVar1) + 8);
    } while (base == (xmlChar *)0x0);
    iVar3 = xmlBuildURISafe(systemId,base,&URI);
    if (URI != (xmlChar *)0x0) {
      iVar3 = xmlStrlen(URI);
      if (2000 < iVar3) {
        xmlFatalErr((xmlParserCtxtPtr)ctx,XML_ERR_RESOURCE_LIMIT,"URI too long");
        (*xmlFree)(URI);
        return;
      }
      ent->URI = URI;
      return;
    }
    if (iVar3 < 0) {
LAB_00144e70:
      xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
      return;
    }
    msg = "Can\'t resolve URI: %s\n";
    error = XML_ERR_INVALID_URI;
  }
  else {
    systemId = name;
    if (iVar2 == 0x75) {
      msg = "Invalid redeclaration of predefined entity \'%s\'";
      error = XML_ERR_REDECL_PREDEF_ENTITY;
    }
    else {
      if (iVar2 != 0x6b) {
        if (iVar2 != 2) {
          xmlFatalErrMsg((xmlParserCtxtPtr)ctx,XML_ERR_INTERNAL_ERROR,
                         "Unexpected error code from xmlAddEntity\n",(xmlChar *)0x0,publicId);
          return;
        }
        goto LAB_00144e70;
      }
      if (*(int *)((long)ctx + 0x1a4) == 0) {
        return;
      }
      if (iVar3 == 2) {
        msg = "Entity(%s) already defined in the external subset\n";
      }
      else {
        msg = "Entity(%s) already defined in the internal subset\n";
      }
      error = XML_WAR_ENTITY_REDEFINED;
    }
  }
  xmlWarnMsg((xmlParserCtxtPtr)ctx,error,msg,systemId);
  return;
}

Assistant:

void
xmlSAX2EntityDecl(void *ctx, const xmlChar *name, int type,
          const xmlChar *publicId, const xmlChar *systemId, xmlChar *content)
{
    xmlEntityPtr ent;
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    int extSubset;
    int res;

    if ((ctxt == NULL) || (ctxt->myDoc == NULL))
        return;

    extSubset = ctxt->inSubset == 2;
    res = xmlAddEntity(ctxt->myDoc, extSubset, name, type, publicId, systemId,
                       content, &ent);
    switch (res) {
        case XML_ERR_OK:
            break;
        case XML_ERR_NO_MEMORY:
            xmlSAX2ErrMemory(ctxt);
            return;
        case XML_WAR_ENTITY_REDEFINED:
            if (ctxt->pedantic) {
                if (extSubset)
                    xmlWarnMsg(ctxt, res, "Entity(%s) already defined in the"
                               " external subset\n", name);
                else
                    xmlWarnMsg(ctxt, res, "Entity(%s) already defined in the"
                               " internal subset\n", name);
            }
            return;
        case XML_ERR_REDECL_PREDEF_ENTITY:
            /*
             * Technically an error but it's a common mistake to get double
             * escaping according to "4.6 Predefined Entities" wrong.
             */
            xmlWarnMsg(ctxt, res, "Invalid redeclaration of predefined"
                       " entity '%s'", name);
            return;
        default:
            xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
                           "Unexpected error code from xmlAddEntity\n",
                           NULL, NULL);
            return;
    }

    if ((ent->URI == NULL) && (systemId != NULL)) {
        xmlChar *URI;
        const char *base = NULL;
        int i;

        for (i = ctxt->inputNr - 1; i >= 0; i--) {
            if (ctxt->inputTab[i]->filename != NULL) {
                base = ctxt->inputTab[i]->filename;
                break;
            }
        }

        /*
         * We don't really need the 'directory' struct member, but some
         * users set it manually to a base URI for memory streams.
         */
        if (base == NULL)
            base = ctxt->directory;

        res = xmlBuildURISafe(systemId, (const xmlChar *) base, &URI);

        if (URI == NULL) {
            if (res < 0) {
                xmlSAX2ErrMemory(ctxt);
            } else {
                xmlWarnMsg(ctxt, XML_ERR_INVALID_URI,
                           "Can't resolve URI: %s\n", systemId);
            }
        } else if (xmlStrlen(URI) > XML_MAX_URI_LENGTH) {
            xmlFatalErr(ctxt, XML_ERR_RESOURCE_LIMIT, "URI too long");
            xmlFree(URI);
        } else {
            ent->URI = URI;
        }
    }
}